

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ParseResult *
read_list(ParseResult *__return_storage_ptr__,istream *is,shared_ptr<ASTNode> *node,bool square)

{
  element_type *peVar1;
  bool bVar2;
  shared_ptr<ASTNode> local_a0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  uint local_30;
  byte local_29;
  int local_28;
  byte local_21;
  int c;
  bool square_local;
  shared_ptr<ASTNode> *node_local;
  istream *is_local;
  ParseResult *object;
  
  local_21 = square;
  _c = (__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node;
  node_local = (shared_ptr<ASTNode> *)is;
  is_local = (istream *)__return_storage_ptr__;
  peVar1 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node
                     );
  peVar1->type = LIST;
  skip_whitespace((istream *)node_local);
  local_28 = std::istream::peek();
  while( true ) {
    bVar2 = false;
    if ((local_28 != -1) && (bVar2 = false, local_28 != 0x29)) {
      bVar2 = local_28 != 0x5d;
    }
    if (!bVar2) break;
    local_29 = 0;
    read_object(__return_storage_ptr__,(istream *)node_local);
    bVar2 = __return_storage_ptr__->result == OK;
    if (bVar2) {
      peVar1 = std::__shared_ptr_access<ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(_c);
      std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
      push_back(&peVar1->list,&__return_storage_ptr__->node);
      local_28 = skip_whitespace((istream *)node_local);
    }
    else {
      local_29 = 1;
    }
    local_30 = (uint)!bVar2;
    if ((local_29 & 1) == 0) {
      ParseResult::~ParseResult(__return_storage_ptr__);
    }
    if (local_30 != 0) {
      return __return_storage_ptr__;
    }
  }
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"Unclosed list literal",&local_61);
    ParseResult::ParseResult(__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    return __return_storage_ptr__;
  }
  std::istream::get();
  if ((local_28 == 0x5d) != (bool)(local_21 & 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"Wrong closing bracket",&local_89);
    ParseResult::ParseResult(__return_storage_ptr__,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    return __return_storage_ptr__;
  }
  std::shared_ptr<ASTNode>::shared_ptr(&local_a0,(shared_ptr<ASTNode> *)_c);
  ParseResult::ParseResult(__return_storage_ptr__,&local_a0);
  std::shared_ptr<ASTNode>::~shared_ptr(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

static ParseResult read_list(std::istream &is, const std::shared_ptr<ASTNode> &node, bool square)
{
    node->type = ast_type_t::LIST;
    skip_whitespace(is);
    int c = is.peek();
    while(c != EOF && c != ')' && c != ']')
    {
        auto object = read_object(is);
        if(object.result != parse_result_t::OK)
            return object;
        node->list.push_back(object.node);
        c = skip_whitespace(is);
    }
    if(c == EOF)
        return ParseResult("Unclosed list literal");
    is.get();
    if((c == ']') != square)
        return ParseResult("Wrong closing bracket");
    return ParseResult(node);
}